

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

void rf_unload_mesh(rf_mesh mesh,rf_allocator allocator)

{
  rf_mesh mesh_00;
  long lVar1;
  code *in_RSI;
  undefined8 *puVar2;
  undefined8 *puVar3;
  undefined8 local_2e8;
  undefined4 in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd24;
  undefined8 in_stack_fffffffffffffd28;
  undefined8 in_stack_fffffffffffffd30;
  undefined8 in_stack_fffffffffffffd38;
  undefined8 in_stack_fffffffffffffd40;
  undefined1 in_stack_fffffffffffffd48 [64];
  uint *in_stack_fffffffffffffd88;
  undefined1 local_38 [8];
  code *local_30;
  
  puVar2 = (undefined8 *)&stack0x00000008;
  puVar3 = &local_2e8;
  local_30 = in_RSI;
  for (lVar1 = 0xe; lVar1 != 0; lVar1 = lVar1 + -1) {
    *puVar3 = *puVar2;
    puVar2 = puVar2 + 1;
    puVar3 = puVar3 + 1;
  }
  mesh_00.triangle_count = in_stack_fffffffffffffd24;
  mesh_00.vertex_count = in_stack_fffffffffffffd20;
  mesh_00.vertices = (float *)in_stack_fffffffffffffd28;
  mesh_00.texcoords = (float *)in_stack_fffffffffffffd30;
  mesh_00.texcoords2 = (float *)in_stack_fffffffffffffd38;
  mesh_00.normals = (float *)in_stack_fffffffffffffd40;
  mesh_00.tangents = (float *)in_stack_fffffffffffffd48._0_8_;
  mesh_00.colors = (uchar *)in_stack_fffffffffffffd48._8_8_;
  mesh_00.indices = (unsigned_short *)in_stack_fffffffffffffd48._16_8_;
  mesh_00.anim_vertices = (float *)in_stack_fffffffffffffd48._24_8_;
  mesh_00.anim_normals = (float *)in_stack_fffffffffffffd48._32_8_;
  mesh_00.bone_ids = (int *)in_stack_fffffffffffffd48._40_8_;
  mesh_00.bone_weights = (float *)in_stack_fffffffffffffd48._48_8_;
  mesh_00.vao_id = in_stack_fffffffffffffd48._56_4_;
  mesh_00._100_4_ = in_stack_fffffffffffffd48._60_4_;
  mesh_00.vbo_id = in_stack_fffffffffffffd88;
  rf_gfx_unload_mesh(mesh_00);
  local_2e8._0_4_ = 0x17c440;
  local_2e8._4_4_ = 0;
  (*local_30)(local_38,3);
  local_2e8._0_4_ = 0x17c440;
  local_2e8._4_4_ = 0;
  (*local_30)(local_38,3);
  local_2e8._0_4_ = 0x17c440;
  local_2e8._4_4_ = 0;
  (*local_30)(local_38,3);
  local_2e8._0_4_ = 0x17c440;
  local_2e8._4_4_ = 0;
  (*local_30)(local_38,3);
  local_2e8._0_4_ = 0x17c440;
  local_2e8._4_4_ = 0;
  (*local_30)(local_38,3);
  local_2e8._0_4_ = 0x17c440;
  local_2e8._4_4_ = 0;
  (*local_30)(local_38,3);
  local_2e8._0_4_ = 0x17c440;
  local_2e8._4_4_ = 0;
  (*local_30)(local_38,3);
  local_2e8._0_4_ = 0x17c440;
  local_2e8._4_4_ = 0;
  (*local_30)(local_38,3);
  local_2e8._0_4_ = 0x17c440;
  local_2e8._4_4_ = 0;
  (*local_30)(local_38,3);
  local_2e8._0_4_ = 0x17c440;
  local_2e8._4_4_ = 0;
  (*local_30)(local_38,3);
  local_2e8._0_4_ = 0x17c440;
  local_2e8._4_4_ = 0;
  (*local_30)(local_38,3);
  local_2e8._0_4_ = 0x17c440;
  local_2e8._4_4_ = 0;
  (*local_30)(local_38,3);
  return;
}

Assistant:

RF_API void rf_unload_mesh(rf_mesh mesh, rf_allocator allocator)
{
    rf_gfx_unload_mesh(mesh);

    RF_FREE(allocator, mesh.vertices);
    RF_FREE(allocator, mesh.texcoords);
    RF_FREE(allocator, mesh.normals);
    RF_FREE(allocator, mesh.colors);
    RF_FREE(allocator, mesh.tangents);
    RF_FREE(allocator, mesh.texcoords2);
    RF_FREE(allocator, mesh.indices);

    RF_FREE(allocator, mesh.anim_vertices);
    RF_FREE(allocator, mesh.anim_normals);
    RF_FREE(allocator, mesh.bone_weights);
    RF_FREE(allocator, mesh.bone_ids);
    RF_FREE(allocator, mesh.vbo_id);
}